

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kron.cpp
# Opt level: O3

void test_qclab_dense_kron<std::complex<float>>(void)

{
  float *pfVar1;
  float fVar2;
  undefined8 *puVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined1 *puVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  long lVar9;
  long lVar10;
  pointer *__ptr;
  pointer *__ptr_2;
  long lVar11;
  char *in_R9;
  pointer *__ptr_3;
  pointer *__ptr_5;
  pointer *__ptr_4;
  undefined1 auVar12 [16];
  AssertHelper local_118;
  undefined1 local_110 [8];
  _Head_base<0UL,_std::complex<float>_*,_false> local_108;
  SquareMatrix<std::complex<float>_> local_100;
  string local_f0;
  internal local_d0;
  undefined7 uStack_cf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  AssertHelper local_c0;
  void *local_b8;
  internal local_b0;
  undefined7 uStack_af;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  AssertHelper local_a0;
  Message local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  SquareMatrix<std::complex<float>_> local_88;
  long local_78;
  void *local_70;
  SquareMatrix<std::complex<float>_> local_68;
  undefined1 *local_58;
  undefined8 uStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  
  local_88.size_ = 2;
  local_88.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
       )operator_new__(0x20);
  *(long *)local_88.data_._M_t.
           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
           _M_t.
           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
           .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       SUB168(ZEXT416(0x3f800000),0);
  *(undefined1 (*) [16])
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 8) =
       (undefined1  [16])0x0;
  *(long *)((long)local_88.data_._M_t.
                  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                  .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 0x18) =
       SUB168(ZEXT416(0x3f800000),0);
  local_68.size_ = 2;
  local_68.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
       )operator_new__(0x20);
  *(undefined8 *)
   local_68.data_._M_t.
   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
   super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl = 0;
  *(long *)((long)local_68.data_._M_t.
                  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                  .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 8) =
       SUB168(ZEXT416(0x3f800000),0);
  *(long *)((long)local_68.data_._M_t.
                  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                  .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 0x10) =
       SUB168(ZEXT416(0x3f800000),0);
  *(undefined8 *)
   ((long)local_68.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 0x18) = 0;
  qclab::dense::kron<std::complex<float>>((dense *)&local_78,&local_88,&local_68);
  puVar3 = (undefined8 *)operator_new__(0x80);
  *puVar3 = 0;
  puVar3[1] = SUB168(ZEXT416(0x3f800000),0);
  *(undefined1 (*) [16])(puVar3 + 2) = (undefined1  [16])0x0;
  puVar3[4] = SUB168(ZEXT416(0x3f800000),0);
  *(undefined1 (*) [16])(puVar3 + 5) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(puVar3 + 7) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(puVar3 + 9) = (undefined1  [16])0x0;
  *(undefined4 *)(puVar3 + 0xb) = 0x3f800000;
  *(undefined1 (*) [16])((long)puVar3 + 0x5c) = (undefined1  [16])0x0;
  *(undefined4 *)((long)puVar3 + 0x6c) = 0;
  auVar12._0_12_ = ZEXT812(0x3f800000);
  auVar12._12_4_ = 0;
  *(undefined1 (*) [16])(puVar3 + 0xe) = auVar12;
  if (local_78 == 4) {
    lVar4 = (long)local_70 + 4;
    lVar9 = (long)puVar3 + 4;
    lVar10 = 0;
    do {
      lVar11 = 0;
      do {
        fVar2 = *(float *)(lVar9 + -4 + lVar11 * 8);
        pfVar1 = (float *)(lVar4 + -4 + lVar11 * 8);
        if ((((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) ||
            (fVar2 = *(float *)(lVar9 + lVar11 * 8), pfVar1 = (float *)(lVar4 + lVar11 * 8),
            fVar2 != *pfVar1)) || (NAN(fVar2) || NAN(*pfVar1))) goto LAB_0019129c;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      lVar10 = lVar10 + 1;
      lVar4 = lVar4 + 0x20;
      lVar9 = lVar9 + 0x20;
    } while (lVar10 != 4);
  }
  else {
LAB_0019129c:
    local_b0 = (internal)0x0;
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,&local_b0,(AssertionResult *)"IoX == IoX_check","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/test/dense/kron.cpp"
               ,0x14,local_f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_110 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
  }
  qclab::dense::kron<std::complex<float>>((dense *)&local_b0,&local_68,&local_88);
  puVar5 = (undefined8 *)operator_new__(0x80);
  *puVar5 = 0;
  puVar5[1] = 0;
  *(undefined4 *)(puVar5 + 2) = 0x3f800000;
  *(undefined8 *)((long)puVar5 + 0x14) = 0;
  *(undefined8 *)((long)puVar5 + 0x1c) = 0;
  *(undefined8 *)((long)puVar5 + 0x24) = 0;
  *(undefined8 *)((long)puVar5 + 0x2c) = 0;
  *(undefined4 *)((long)puVar5 + 0x34) = 0;
  puVar5[7] = 0x3f800000;
  puVar5[8] = 0x3f800000;
  puVar5[9] = 0;
  puVar5[10] = 0;
  puVar5[0xb] = 0;
  puVar5[0xc] = 0;
  puVar5[0xd] = 0x3f800000;
  puVar5[0xe] = 0;
  puVar5[0xf] = 0;
  if (CONCAT71(uStack_af,local_b0) == 4) {
    puVar6 = (undefined1 *)((long)&(local_a8->_M_dataplus)._M_p + 4);
    lVar4 = (long)puVar5 + 4;
    lVar9 = 0;
    do {
      lVar10 = 0;
      do {
        fVar2 = *(float *)(lVar4 + -4 + lVar10 * 8);
        if (((fVar2 != *(float *)(puVar6 + lVar10 * 8 + -4)) ||
            (NAN(fVar2) || NAN(*(float *)(puVar6 + lVar10 * 8 + -4)))) ||
           ((fVar2 = *(float *)(lVar4 + lVar10 * 8), fVar2 != *(float *)(puVar6 + lVar10 * 8) ||
            (NAN(fVar2) || NAN(*(float *)(puVar6 + lVar10 * 8)))))) goto LAB_0019140f;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      lVar9 = lVar9 + 1;
      puVar6 = puVar6 + 0x20;
      lVar4 = lVar4 + 0x20;
    } while (lVar9 != 4);
  }
  else {
LAB_0019140f:
    local_110 = (undefined1  [8])((ulong)local_110 & 0xffffffffffffff00);
    local_108._M_head_impl = (complex<float> *)0x0;
    testing::Message::Message((Message *)&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,(internal *)local_110,(AssertionResult *)"XoI == XoI_check","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/test/dense/kron.cpp"
               ,0x1c,local_f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_100.size_ != (long *)0x0) {
      (**(code **)(*(long *)local_100.size_ + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_108._M_head_impl);
    }
  }
  local_110 = (undefined1  [8])0x2;
  local_108._M_head_impl = (complex<float> *)operator_new__(0x20);
  *local_108._M_head_impl = 0x3f800000;
  *(undefined1 **)((long)local_108._M_head_impl + 8) = &DAT_40400000;
  *(undefined8 *)((long)local_108._M_head_impl + 0x10) = 0x40000000;
  *(undefined1 **)((long)local_108._M_head_impl + 0x18) = &DAT_40a00000;
  local_100.size_ = 2;
  local_100.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
       )operator_new__(0x20);
  local_48 = &DAT_40e00000;
  puStack_40 = &DAT_41500000;
  *(undefined1 **)
   local_100.data_._M_t.
   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
   super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl = &DAT_40e00000;
  *(undefined1 **)
   ((long)local_100.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 8) = &DAT_41500000;
  local_58 = &DAT_41300000;
  uStack_50 = 0x41880000;
  *(undefined1 **)
   ((long)local_100.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 0x10) = &DAT_41300000;
  *(undefined8 *)
   ((long)local_100.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 0x18) = 0x41880000;
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_c0,(SquareMatrix<std::complex<float>_> *)local_110,&local_100);
  puVar7 = (undefined8 *)operator_new__(0x80);
  *puVar7 = local_48;
  puVar7[1] = puStack_40;
  puVar7[2] = 0x41a80000;
  puVar7[3] = 0x421c0000;
  puVar7[4] = local_58;
  puVar7[5] = uStack_50;
  puVar7[6] = 0x42040000;
  puVar7[7] = 0x424c0000;
  puVar7[8] = &DAT_41600000;
  puVar7[9] = 0x41d00000;
  puVar7[10] = 0x420c0000;
  puVar7[0xb] = 0x42820000;
  puVar7[0xc] = 0x41b00000;
  puVar7[0xd] = 0x42080000;
  puVar7[0xe] = 0x425c0000;
  puVar7[0xf] = 0x42aa0000;
  if (local_c0.data_ == (AssertHelperData *)&DAT_00000004) {
    lVar4 = (long)local_b8 + 4;
    lVar9 = (long)puVar7 + 4;
    lVar10 = 0;
    do {
      lVar11 = 0;
      do {
        fVar2 = *(float *)(lVar9 + -4 + lVar11 * 8);
        pfVar1 = (float *)(lVar4 + -4 + lVar11 * 8);
        if (((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) ||
           ((fVar2 = *(float *)(lVar9 + lVar11 * 8), pfVar1 = (float *)(lVar4 + lVar11 * 8),
            fVar2 != *pfVar1 || (NAN(fVar2) || NAN(*pfVar1))))) goto LAB_00191649;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      lVar10 = lVar10 + 1;
      lVar4 = lVar4 + 0x20;
      lVar9 = lVar9 + 0x20;
    } while (lVar10 != 4);
  }
  else {
LAB_00191649:
    local_d0 = (internal)0x0;
    local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message(&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,&local_d0,(AssertionResult *)"AoB == AoB_check","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/test/dense/kron.cpp"
               ,0x2b,local_f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_118,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_98.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_98.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_98.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_98.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
    if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c8,local_c8);
    }
  }
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_d0,&local_100,(SquareMatrix<std::complex<float>_> *)local_110);
  puVar8 = (undefined8 *)operator_new__(0x80);
  *puVar8 = &DAT_40e00000;
  puVar8[1] = 0x41a80000;
  puVar8[2] = &DAT_41500000;
  puVar8[3] = 0x421c0000;
  puVar8[4] = &DAT_41600000;
  puVar8[5] = 0x420c0000;
  puVar8[6] = 0x41d00000;
  puVar8[7] = 0x42820000;
  puVar8[8] = &DAT_41300000;
  puVar8[9] = 0x42040000;
  puVar8[10] = 0x41880000;
  puVar8[0xb] = 0x424c0000;
  puVar8[0xc] = 0x41b00000;
  puVar8[0xd] = 0x425c0000;
  puVar8[0xe] = 0x42080000;
  puVar8[0xf] = 0x42aa0000;
  if (CONCAT71(uStack_cf,local_d0) == 4) {
    puVar6 = (undefined1 *)((long)&(local_c8->_M_dataplus)._M_p + 4);
    lVar4 = (long)puVar8 + 4;
    lVar9 = 0;
    do {
      lVar10 = 0;
      do {
        fVar2 = *(float *)(lVar4 + -4 + lVar10 * 8);
        if ((((fVar2 != *(float *)(puVar6 + lVar10 * 8 + -4)) ||
             (NAN(fVar2) || NAN(*(float *)(puVar6 + lVar10 * 8 + -4)))) ||
            (fVar2 = *(float *)(lVar4 + lVar10 * 8), fVar2 != *(float *)(puVar6 + lVar10 * 8))) ||
           (NAN(fVar2) || NAN(*(float *)(puVar6 + lVar10 * 8)))) goto LAB_00191801;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      lVar9 = lVar9 + 1;
      puVar6 = puVar6 + 0x20;
      lVar4 = lVar4 + 0x20;
    } while (lVar9 != 4);
  }
  else {
LAB_00191801:
    local_98.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)0x0;
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,(internal *)&local_98,(AssertionResult *)"BoA == BoA_check","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/test/dense/kron.cpp"
               ,0x33,local_f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_118.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_118.data_ + 8))();
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
  }
  operator_delete__(puVar8);
  if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_c8);
  }
  operator_delete__(puVar7);
  if (local_b8 != (void *)0x0) {
    operator_delete__(local_b8);
  }
  if (local_100.data_._M_t.
      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
      super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0) {
    operator_delete__((void *)local_100.data_._M_t.
                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                              .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl);
  }
  if ((_Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>)
      local_108._M_head_impl != (complex<float> *)0x0) {
    operator_delete__(local_108._M_head_impl);
  }
  operator_delete__(puVar5);
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_a8);
  }
  operator_delete__(puVar3);
  if (local_70 != (void *)0x0) {
    operator_delete__(local_70);
  }
  if (local_68.data_._M_t.
      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
      super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0) {
    operator_delete__((void *)local_68.data_._M_t.
                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                              .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl);
  }
  if (local_88.data_._M_t.
      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
      super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0) {
    operator_delete__((void *)local_88.data_._M_t.
                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                              .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void test_qclab_dense_kron() {

  qclab::dense::SquareMatrix< T >  I( 1 , 0 ,
                                      0 , 1 ) ;
  qclab::dense::SquareMatrix< T >  X( 0 , 1 ,
                                      1 , 0 ) ;
//std::cout << "I =\n" ; qclab::printMatrix2x2( I ) ;
//std::cout << "X =\n" ; qclab::printMatrix2x2( X ) ;

  qclab::dense::SquareMatrix< T >  IoX = qclab::dense::kron( I , X ) ;
  qclab::dense::SquareMatrix< T >  IoX_check( 0 , 1 , 0 , 0 ,
                                              1 , 0 , 0 , 0 ,
                                              0 , 0 , 0 , 1 ,
                                              0 , 0 , 1 , 0 ) ;
  EXPECT_TRUE( IoX == IoX_check ) ;
//std::cout << "I otimes X =\n" ; qclab::printMatrix4x4( IoX ) ;

  qclab::dense::SquareMatrix< T >  XoI = qclab::dense::kron( X , I ) ;
  qclab::dense::SquareMatrix< T >  XoI_check( 0 , 0 , 1 , 0 ,
                                              0 , 0 , 0 , 1 ,
                                              1 , 0 , 0 , 0 ,
                                              0 , 1 , 0 , 0 ) ;
  EXPECT_TRUE( XoI == XoI_check ) ;
//std::cout << "X otimes I =\n" ; qclab::printMatrix4x4( XoI ) ;

  qclab::dense::SquareMatrix< T >  A(  1 ,  2 ,
                                       3 ,  5 ) ;
  qclab::dense::SquareMatrix< T >  B(  7 , 11 ,
                                      13 , 17 ) ;
//std::cout << "A =\n" ; qclab::printMatrix2x2( A ) ;
//std::cout << "B =\n" ; qclab::printMatrix2x2( B ) ;

  qclab::dense::SquareMatrix< T >  AoB = qclab::dense::kron( A , B ) ;
  qclab::dense::SquareMatrix< T >  AoB_check(  7 , 11 , 14 , 22 ,
                                              13 , 17 , 26 , 34 ,
                                              21 , 33 , 35 , 55 ,
                                              39 , 51 , 65 , 85 ) ;
  EXPECT_TRUE( AoB == AoB_check ) ;
//std::cout << "A otimes B =\n" ; qclab::printMatrix4x4( AoB ) ;

  qclab::dense::SquareMatrix< T >  BoA = qclab::dense::kron( B , A ) ;
  qclab::dense::SquareMatrix< T >  BoA_check(  7 , 14 , 11 , 22 ,
                                              21 , 35 , 33 , 55 ,
                                              13 , 26 , 17 , 34 ,
                                              39 , 65 , 51 , 85 ) ;
  EXPECT_TRUE( BoA == BoA_check ) ;
//std::cout << "B otimes A =\n" ; qclab::printMatrix4x4( BoA ) ;

}